

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

_Bool borg_flow_take(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t y2;
  wchar_t wVar5;
  loc grid2;
  borg_take *pbVar6;
  borg_take *take;
  borg_grid *ag;
  wchar_t full_quiver;
  wchar_t leash;
  wchar_t b_j;
  wchar_t j;
  wchar_t b_stair;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  wchar_t nearness_local;
  _Bool viewable_local;
  
  b_j = L'\xffffffff';
  full_quiver = L'\xffffffff';
  ag._4_4_ = borg.trait[0x23] * 3 + L'\t';
  if (borg.trait[0x35] == 0) {
    ag._0_4_ = z_info->quiver_slot_size - 1;
  }
  else {
    ag._0_4_ = (z_info->quiver_slot_size - 1) * 2;
  }
  if (borg_takes_cnt == 0) {
    i._3_1_ = false;
  }
  else if (borg_items[(int)(((uint)z_info->pack_size - borg.trait[0x9e]) + -1)].iqty == '\0') {
    if (scaryguy_on_level) {
      i._3_1_ = false;
    }
    else if (borg.trait[0x1a] == 0) {
      i._3_1_ = false;
    }
    else if (borg_morgoth_position) {
      i._3_1_ = false;
    }
    else {
      if (0x13 < borg.trait[0x23]) {
        ag._4_4_ = L'ú';
      }
      borg_temp_n = 0;
      for (y = L'\0'; y < track_less.num; y = y + L'\x01') {
        grid2 = loc(track_less.x[y],track_less.y[y]);
        wVar4 = distance(borg.c,grid2);
        if (full_quiver < wVar4) {
          b_j = y;
          full_quiver = wVar4;
        }
      }
      for (y = L'\x01'; y < borg_takes_nxt; y = y + L'\x01') {
        pbVar6 = borg_takes + y;
        if (pbVar6->kind != (object_kind *)0x0) {
          bVar1 = pbVar6->x;
          wVar4 = (wchar_t)bVar1;
          bVar2 = pbVar6->y;
          y2 = (wchar_t)bVar2;
          if ((((((((b_j == L'\xffffffff') || (9 < borg.trait[0x23])) ||
                  (wVar5 = borg_distance(track_less.y[b_j],track_less.x[b_j],y2,wVar4),
                  ag._4_4_ < full_quiver)) || (wVar5 < ag._4_4_)) &&
                ((L'\0' < pbVar6->value &&
                 ((!viewable || ((borg_grids[y2][wVar4].info & 0x20) != 0)))))) &&
               ((pbVar6->tval != borg.trait[0x98] || (borg.trait[0x9b] < (int)ag)))) &&
              (((borg.trait[0x2d] < 500000 || (borg_cfg[0x18] != 0)) ||
               (((pbVar6->tval != L'#' &&
                 ((_Var3 = tval_is_book_k(k_info + pbVar6->kind->kidx), !_Var3 ||
                  (_Var3 = obj_kind_can_browse(k_info + pbVar6->kind->kidx), _Var3)))) &&
                (((pbVar6->tval != L'\x02' &&
                  ((pbVar6->tval != L'\x03' && (pbVar6->tval != L'\x04')))) ||
                 (pbVar6->tval == borg.trait[0x98])))))))) &&
             (((borg_flow_clear(), nearness < L'\x06' || (0x13 < borg.trait[0x23])) ||
              (wVar4 = borg_flow_cost_stair(y2,wVar4,b_j), wVar4 <= ag._4_4_)))) {
            borg_temp_x[borg_temp_n] = bVar1;
            borg_temp_y[borg_temp_n] = bVar2;
            borg_temp_n = borg_temp_n + 1;
          }
        }
      }
      if (borg_temp_n == 0) {
        i._3_1_ = false;
      }
      else {
        borg_flow_clear();
        for (y = L'\0'; y < borg_temp_n; y = y + L'\x01') {
          borg_flow_enqueue_grid((uint)borg_temp_y[y],(uint)borg_temp_x[y]);
        }
        borg_flow_spread(nearness,true,(_Bool)((viewable ^ 0xffU) & 1),false,L'\xffffffff',false);
        _Var3 = borg_flow_commit("item",L'\x02');
        if (_Var3) {
          _Var3 = borg_flow_old(L'\x02');
          if (_Var3) {
            i._3_1_ = true;
          }
          else {
            i._3_1_ = false;
          }
        }
        else {
          i._3_1_ = false;
        }
      }
    }
  }
  else {
    i._3_1_ = false;
  }
  return i._3_1_;
}

Assistant:

bool borg_flow_take(bool viewable, int nearness)
{
    int i, x, y;
    int b_stair = -1, j, b_j = -1;
    int leash = borg.trait[BI_CLEVEL] * 3 + 9;
    int full_quiver;

    borg_grid *ag;

    /* Missile carry limit */
    /* allow shooters to two quiver slots full */
    if (borg.trait[BI_FAST_SHOTS])
        full_quiver = (z_info->quiver_slot_size - 1) * 2;
    else
        full_quiver = z_info->quiver_slot_size - 1;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* If ScaryGuy, no chasing down items */
    if (scaryguy_on_level)
        return false;

    /* If out of fuel, don't mess around */
    if (!borg.trait[BI_LIGHT])
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;

    /* increase leash */
    if (borg.trait[BI_CLEVEL] >= 20)
        leash = 250;

    /* Starting over on count */
    borg_temp_n = 0;

    /* Check distance away from stairs, used later */
    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the object list */
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take *take = &borg_takes[i];

        /* Skip dead objects */
        if (!take->kind)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* Skip ones that make me wander too far */
        if (b_stair != -1 && borg.trait[BI_CLEVEL] < 10) {
            /* Check the distance of this 'take' to the stair */
            j = borg_distance(
                track_less.y[b_stair], track_less.x[b_stair], y, x);
            /* skip far away takes while I am close to stair*/
            if (b_j <= leash && j >= leash)
                continue;
        }

        /* skip worthless items */
        if (take->value <= 0)
            continue;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* Don't bother with ammo if I am at capacity */

        if (take->tval == borg.trait[BI_AMMO_TVAL]
            && borg.trait[BI_AMISSILES] >= full_quiver)
            continue;
        /* No need to chase certain things down after a certain amount.  Don't
         * chase: Money Other spell books Wrong ammo
         */
        if (borg.trait[BI_GOLD] >= 500000
            && borg_cfg[BORG_MONEY_SCUM_AMOUNT] == 0) {
            if (take->tval == TV_GOLD)
                continue;
            if (tval_is_book_k(&k_info[take->kind->kidx])
                && !obj_kind_can_browse(&k_info[take->kind->kidx]))
                continue;
            if ((take->tval == TV_SHOT || take->tval == TV_ARROW
                    || take->tval == TV_BOLT)
                && take->tval != borg.trait[BI_AMMO_TVAL])
                continue;
            /*
            Restore Mana for warriors?
            low level potions
            low level scrolls
            */
        }

        /* Clear the flow codes */
        borg_flow_clear();


        /* Check the distance to stair for this proposed grid and leash*/
        if (nearness > 5 && borg.trait[BI_CLEVEL] < 20
            && borg_flow_cost_stair(y, x, b_stair) > leash)
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unkown squares.  This was for performance. */
    borg_flow_spread(nearness, true, !viewable, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("item", GOAL_TAKE))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}